

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

pool_ptr<soul::AST::Function> __thiscall
soul::ResolutionPass::GenericFunctionResolver::getOrCreateSpecialisedFunction
          (GenericFunctionResolver *this,CallOrCast *call,Function *genericFunction,
          ArrayView<soul::Type> callerArgumentTypes,bool shouldIgnoreErrors)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *pcVar1;
  _Alloc_hider _Var2;
  CallOrCast *this_00;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  Function *function;
  long *plVar5;
  Identifier IVar6;
  Function *function_00;
  size_type *psVar7;
  TypeArray *types;
  Function *pFVar8;
  undefined7 in_register_00000089;
  undefined8 *puVar9;
  ArrayView<soul::Type> callerArgumentTypes_00;
  string_view newString;
  undefined1 auVar10 [16];
  bool in_stack_00000008;
  string callerSignatureID;
  TypeArray resolvedTypes;
  string local_178;
  CallOrCast *local_158;
  Function *local_150;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [216];
  
  callerArgumentTypes_00.e._1_7_ = in_register_00000089;
  callerArgumentTypes_00.e._0_1_ = shouldIgnoreErrors;
  function_00 = (Function *)callerArgumentTypes.s;
  local_150 = (Function *)this;
  iVar4 = (*(function_00->super_ASTObject)._vptr_ASTObject[3])(function_00);
  plVar5 = (long *)CONCAT44(extraout_var,iVar4);
  if (plVar5 == (long *)0x0) {
    throwInternalCompilerError("parentScope != nullptr","getOrCreateSpecialisedFunction",0xaa1);
  }
  local_108._0_8_ = local_108 + 0x18;
  local_108._8_8_ = 0;
  local_108._16_8_ = 8;
  callerArgumentTypes_00.s = callerArgumentTypes.e;
  local_158 = call;
  bVar3 = findGenericFunctionTypes
                    ((GenericFunctionResolver *)call,(CallOrCast *)genericFunction,function_00,
                     callerArgumentTypes_00,(TypeArray *)local_108,in_stack_00000008);
  pFVar8 = local_150;
  if (bVar3) {
    ASTUtilities::getTypeArraySignature_abi_cxx11_(&local_148,(ASTUtilities *)local_108,types);
    auVar10 = (**(code **)(*plVar5 + 0x68))(plVar5);
    puVar9 = auVar10._0_8_;
    if (puVar9 != auVar10._8_8_) {
      do {
        if ((((Function *)*puVar9)->originalGenericFunction).object == function_00) {
          getIDStringForFunction_abi_cxx11_
                    (&local_178,(GenericFunctionResolver *)local_158,(Function *)*puVar9);
          _Var2._M_p = local_178._M_dataplus._M_p;
          if (local_178._M_string_length == local_148._M_string_length) {
            if (local_178._M_string_length == 0) {
              bVar3 = true;
            }
            else {
              iVar4 = bcmp(local_178._M_dataplus._M_p,local_148._M_dataplus._M_p,
                           local_178._M_string_length);
              bVar3 = iVar4 == 0;
            }
          }
          else {
            bVar3 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var2._M_p != &local_178.field_2) {
            operator_delete(_Var2._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          pFVar8 = local_150;
          if (bVar3) {
            function = (Function *)*puVar9;
            goto LAB_0021cf32;
          }
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 != auVar10._8_8_);
    }
    this_00 = local_158;
    function = StructuralParser::cloneFunction
                         ((Allocator *)
                          (local_158->super_CallOrCastBase).super_Expression.super_Statement.
                          super_ASTObject.context.location.location.data,function_00);
    __rhs = (function_00->name).name;
    if (__rhs == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      throwInternalCompilerError("isValid()","toString",0x23);
    }
    pcVar1 = (this_00->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
             context.location.location.data;
    std::operator+(&local_128,"_",__rhs);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_128);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_178.field_2._M_allocated_capacity = *psVar7;
      local_178.field_2._8_8_ = plVar5[3];
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar7;
      local_178._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_178._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    newString._M_str = local_178._M_dataplus._M_p;
    newString._M_len = local_178._M_string_length;
    IVar6 = Identifier::Pool::get((Pool *)(pcVar1 + 0x20),newString);
    (function->name).name = IVar6.name;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    (function->originalGenericFunction).object = function_00;
    applyGenericFunctionTypes((GenericFunctionResolver *)this_00,function,(TypeArray *)local_108);
LAB_0021cf32:
    (pFVar8->super_ASTObject)._vptr_ASTObject = (_func_int **)function;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (local_150->super_ASTObject)._vptr_ASTObject = (_func_int **)0x0;
  }
  ArrayWithPreallocation<soul::Type,_8UL>::clear
            ((ArrayWithPreallocation<soul::Type,_8UL> *)local_108);
  return (pool_ptr<soul::AST::Function>)pFVar8;
}

Assistant:

pool_ptr<AST::Function> getOrCreateSpecialisedFunction (AST::CallOrCast& call,
                                                                AST::Function& genericFunction,
                                                                ArrayView<Type> callerArgumentTypes,
                                                                bool shouldIgnoreErrors)
        {
            auto parentScope = genericFunction.getParentScope();
            SOUL_ASSERT (parentScope != nullptr);

            AST::TypeArray resolvedTypes;

            if (findGenericFunctionTypes (call, genericFunction, callerArgumentTypes, resolvedTypes, shouldIgnoreErrors))
            {
                auto callerSignatureID = ASTUtilities::getTypeArraySignature (resolvedTypes);

                for (auto& f : parentScope->getFunctions())
                    if (f->originalGenericFunction == genericFunction && getIDStringForFunction (f) == callerSignatureID)
                        return f;

                auto& newFunction = StructuralParser::cloneFunction (allocator, genericFunction);
                newFunction.name = allocator.get ("_" + genericFunction.name.toString() + heart::getGenericSpecialisationNameTag());
                newFunction.originalGenericFunction = genericFunction;
                applyGenericFunctionTypes (newFunction, resolvedTypes);

                return newFunction;
            }

            return {};
        }